

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UBool u_strHasMoreChar32Than_63(UChar *s,int32_t length,int32_t number)

{
  UChar *pUVar1;
  int local_34;
  int32_t maxSupplementary;
  UChar *limit;
  int local_20;
  UChar c;
  int32_t number_local;
  int32_t length_local;
  UChar *s_local;
  
  if (number < 0) {
    s_local._7_1_ = '\x01';
  }
  else if ((s == (UChar *)0x0) || (length < -1)) {
    s_local._7_1_ = '\0';
  }
  else {
    local_20 = number;
    _number_local = s;
    if (length == -1) {
      while( true ) {
        pUVar1 = _number_local + 1;
        if (*_number_local == L'\0') break;
        if (local_20 == 0) {
          return '\x01';
        }
        if (((*_number_local & 0xfc00U) == 0xd800) && ((*pUVar1 & 0xfc00U) == 0xdc00)) {
          pUVar1 = _number_local + 2;
        }
        _number_local = pUVar1;
        local_20 = local_20 + -1;
      }
      s_local._7_1_ = '\0';
    }
    else if (number < (length + 1) / 2) {
      s_local._7_1_ = '\x01';
    }
    else {
      local_34 = length - number;
      if (local_34 < 1) {
        s_local._7_1_ = '\0';
      }
      else {
        while (_number_local != s + length) {
          if (local_20 == 0) {
            return '\x01';
          }
          pUVar1 = _number_local + 1;
          if ((((*_number_local & 0xfc00U) == 0xd800) && (pUVar1 != s + length)) &&
             ((*pUVar1 & 0xfc00U) == 0xdc00)) {
            local_34 = local_34 + -1;
            pUVar1 = _number_local + 2;
            if (local_34 < 1) {
              return '\0';
            }
          }
          _number_local = pUVar1;
          local_20 = local_20 + -1;
        }
        s_local._7_1_ = '\0';
      }
    }
  }
  return s_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
u_strHasMoreChar32Than(const UChar *s, int32_t length, int32_t number) {

    if(number<0) {
        return TRUE;
    }
    if(s==NULL || length<-1) {
        return FALSE;
    }

    if(length==-1) {
        /* s is NUL-terminated */
        UChar c;

        /* count code points until they exceed */
        for(;;) {
            if((c=*s++)==0) {
                return FALSE;
            }
            if(number==0) {
                return TRUE;
            }
            if(U16_IS_LEAD(c) && U16_IS_TRAIL(*s)) {
                ++s;
            }
            --number;
        }
    } else {
        /* length>=0 known */
        const UChar *limit;
        int32_t maxSupplementary;

        /* s contains at least (length+1)/2 code points: <=2 UChars per cp */
        if(((length+1)/2)>number) {
            return TRUE;
        }

        /* check if s does not even contain enough UChars */
        maxSupplementary=length-number;
        if(maxSupplementary<=0) {
            return FALSE;
        }
        /* there are maxSupplementary=length-number more UChars than asked-for code points */

        /*
         * count code points until they exceed and also check that there are
         * no more than maxSupplementary supplementary code points (UChar pairs)
         */
        limit=s+length;
        for(;;) {
            if(s==limit) {
                return FALSE;
            }
            if(number==0) {
                return TRUE;
            }
            if(U16_IS_LEAD(*s++) && s!=limit && U16_IS_TRAIL(*s)) {
                ++s;
                if(--maxSupplementary<=0) {
                    /* too many pairs - too few code points */
                    return FALSE;
                }
            }
            --number;
        }
    }
}